

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  timediff_t tVar4;
  ulong uVar5;
  time_t tVar6;
  curltime cVar7;
  curltime older;
  curltime newer;
  curltime newer_00;
  curltime t;
  long local_38;
  uint uStack_30;
  undefined4 uStack_2c;
  
  pvVar1 = cf->ctx;
  local_38 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if ((*(char *)((long)pvVar1 + 0x84) == '\x01') &&
     (plVar2 = *(long **)((long)pvVar1 + 0x60), plVar2 != (long *)0x0)) {
    uVar5 = 0;
    iVar3 = (**(code **)(*plVar2 + 0x68))(plVar2,data,query,0,&local_38);
    tVar6 = 0;
    if (iVar3 != 0) goto LAB_005e2f99;
    newer.tv_usec = uStack_30;
    newer.tv_sec = local_38;
    if (uStack_30 != 0 || local_38 != 0) {
      uVar5 = 0;
      newer._12_4_ = 0;
      tVar4 = Curl_timediff_us(newer,(curltime)ZEXT816(0));
      tVar6 = 0;
      if (0 < tVar4) {
        uVar5 = (ulong)uStack_30;
        tVar6 = local_38;
      }
      goto LAB_005e2f99;
    }
  }
  uVar5 = 0;
  tVar6 = 0;
LAB_005e2f99:
  local_38 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  if ((*(char *)((long)pvVar1 + 0x54) == '\x01') &&
     (plVar2 = *(long **)((long)pvVar1 + 0x30), plVar2 != (long *)0x0)) {
    iVar3 = (**(code **)(*plVar2 + 0x68))(plVar2,data,query,0,&local_38);
    if ((iVar3 == 0) &&
       (newer_00.tv_usec = uStack_30, newer_00.tv_sec = local_38, uStack_30 != 0 || local_38 != 0))
    {
      older._8_8_ = uVar5;
      older.tv_sec = tVar6;
      newer_00._12_4_ = 0;
      tVar4 = Curl_timediff_us(newer_00,older);
      if (0 < tVar4) {
        uVar5 = (ulong)uStack_30;
        tVar6 = local_38;
      }
    }
  }
  cVar7._8_8_ = uVar5;
  cVar7.tv_sec = tVar6;
  return cVar7;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct Curl_cfilter *cfb;
  struct curltime t, tmax;

  memset(&tmax, 0, sizeof(tmax));
  memset(&t, 0, sizeof(t));
  cfb = ctx->h21_baller.enabled? ctx->h21_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  memset(&t, 0, sizeof(t));
  cfb = ctx->h3_baller.enabled? ctx->h3_baller.cf : NULL;
  if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
    if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
      tmax = t;
  }
  return tmax;
}